

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void ensureBits9(LodePNGBitReader *reader,size_t nbits)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = reader->bp >> 3;
  if (uVar2 + 1 < reader->size) {
    uVar1 = (uint)*(ushort *)(reader->data + uVar2);
  }
  else {
    reader->buffer = 0;
    uVar1 = 0;
    if (uVar2 < reader->size) {
      uVar1 = (uint)reader->data[uVar2];
    }
  }
  reader->buffer = uVar1 >> ((byte)reader->bp & 7);
  return;
}

Assistant:

static LODEPNG_INLINE void ensureBits9(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 1u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u);
    reader->buffer >>= (reader->bp & 7u);
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer = reader->data[start + 0];
    reader->buffer >>= (reader->bp & 7u);
  }
  (void)nbits;
}